

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O0

nanoseconds binlog::ticksToNanoseconds(uint64_t frequency,int64_t ticks)

{
  long in_RSI;
  long in_RDI;
  int64_t r;
  int64_t q;
  int64_t sf;
  long local_38;
  long local_30;
  long local_28;
  rep local_8;
  
  local_28 = in_RSI / in_RDI;
  local_30 = in_RSI % in_RDI;
  local_38 = local_28 * 1000000000 + (local_30 * 1000000000) / in_RDI;
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,void>
            ((duration<long,std::ratio<1l,1000000000l>> *)&local_8,&local_38);
  return (nanoseconds)local_8;
}

Assistant:

std::chrono::nanoseconds ticksToNanoseconds(std::uint64_t frequency, std::int64_t ticks)
{
  // Compute `ticks * std::nano::den / frequency`.
  // To avoid `ticks * std::nano::den` overflowing, assume that:
  //   ticks = q*f + r    and     r < f
  // then multiply and divide the additives one by one.
  // We assume that the result fits on 64 bits, as that many nanos cover a long timespan.
  const std::int64_t sf = std::int64_t(frequency);
  const std::int64_t q = ticks / sf;
  const std::int64_t r = ticks % sf;
  return std::chrono::nanoseconds{q * std::nano::den + r * std::nano::den / sf};
}